

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapMatrix.cpp
# Opt level: O1

Matrix<double,_3,_9,_0,_3,_9> *
mnf::ExpMapMatrix::diffPseudoLog0_
          (Matrix<double,_3,_9,_0,_3,_9> *__return_storage_ptr__,ConstRefVec *R)

{
  long lVar1;
  double *pdVar2;
  ActualDstType actualDst;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  memset(__return_storage_ptr__,0,0xd8);
  lVar1 = (R->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  if (((5 < lVar1) && (7 < lVar1)) && (lVar1 != 8)) {
    pdVar2 = (R->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ).
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
             .m_data;
    dVar8 = (pdVar2[5] - pdVar2[7]) * 0.5;
    dVar6 = (pdVar2[6] - pdVar2[2]) * 0.5;
    dVar9 = (pdVar2[1] - pdVar2[3]) * 0.5;
    dVar7 = *pdVar2 + pdVar2[4] + pdVar2[8];
    dVar3 = (dVar7 + -1.0) * 0.5;
    dVar4 = acos(dVar3);
    if (0.00040283203125 <= ABS(dVar4)) {
      dVar5 = sin(dVar4);
      dVar5 = dVar5 / dVar4;
    }
    else {
      dVar5 = (dVar4 * dVar4) / -6.0 + 1.0;
    }
    if (1e-10 <= dVar9 * dVar9 + dVar6 * dVar6 + dVar8 * dVar8) {
      dVar4 = 1.0 - dVar3 * dVar3;
      dVar3 = (dVar3 * (1.0 / dVar5) + -1.0) / (dVar4 + dVar4);
    }
    else {
      dVar4 = dVar7 + -3.0;
      dVar3 = dVar4 * dVar4 * dVar4;
      dVar3 = (dVar4 * dVar3 * -5.0) / 2772.0 +
              (dVar3 + dVar3) / 315.0 + (dVar4 * dVar4 * -3.0) / 140.0 + dVar7 / 15.0;
    }
    dVar4 = (1.0 / dVar5) * 0.5;
    dVar9 = dVar9 * dVar3;
    dVar8 = dVar8 * dVar3;
    dVar6 = dVar6 * dVar3;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0] = dVar8;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[1] = dVar6;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[2] = dVar9;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[3] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[4] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[5] = dVar4;
    dVar3 = -dVar4;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[6] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[7] = dVar3;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[8] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[9] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[10] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0xb] = dVar3;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0xc] = dVar8;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0xd] = dVar6;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0xe] = dVar9;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0xf] = dVar4;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0x10] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0x11] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0x12] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0x13] = dVar4;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0x14] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0x15] = dVar3;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0x16] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0x17] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0x18] = dVar8;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0x19] = dVar6;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
    .m_data.array[0x1a] = dVar9;
    return __return_storage_ptr__;
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, 0>::operator()(Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

Eigen::Matrix<double, 3, 9> ExpMapMatrix::diffPseudoLog0_(const ConstRefVec& R)
{
  Eigen::Matrix<double, 3, 9> J;
  J.setZero();
  // Valid approximation of the log when v<<1
  Eigen::Vector3d v((R(5) - R(7)) / 2, (R(6) - R(2)) / 2, (R(1) - R(3)) / 2);

  double trR = R(0) + R(4) + R(8);  // Trace of R;
  double trRm1o2 = (trR - 1) / 2;
  double s2 = 1 - trRm1o2 * trRm1o2;
  double f = 1 / boost::math::sinc_pi(
                     acos(trRm1o2));  //=acos(trRm1o2)/sin(acos(trRm1o2));
  double hf = f / 2;
  double df;
  if (v.squaredNorm() < 1e-10)  // Probably should not use this switch value
                                // here
  {
    // TODO: I do not know how to test that. Verification with finite
    // differences proved unefficient. Need to get back to it later.
    //
    // Here we use the Taylor approximation of the diff of the log
    double x = trR - 3;
    df = trR / 15 - (3 * (x * x)) / 140 + (2 * (x * x * x)) / 315 -
         (5 * (x * x * x * x)) / 2772 - 11 / 30;
  }
  else
  {
    df = (trRm1o2 * f - 1) / (2 * s2);
  }
  J.col(0) = df * v;
  J.col(1) = Eigen::Vector3d(0, 0, hf);
  J.col(2) = Eigen::Vector3d(0, -hf, 0);
  J.col(3) = Eigen::Vector3d(0, 0, -hf);
  J.col(4) = J.col(0);
  J.col(5) = Eigen::Vector3d(hf, 0, 0);
  J.col(6) = Eigen::Vector3d(0, hf, 0);
  J.col(7) = Eigen::Vector3d(-hf, 0, 0);
  J.col(8) = J.col(0);
  return J;
}